

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall Thread::start(Thread *this)

{
  uint __line;
  int iVar1;
  ThreadData *this_00;
  void *__stat_loc;
  char *__assertion;
  
  if (this->started_ == true) {
    __assertion = "!started_";
    __line = 0x54;
  }
  else {
    this->started_ = true;
    this_00 = (ThreadData *)operator_new(0x50);
    ThreadData::ThreadData(this_00,&this->func_,&this->name_,&this->tid_,&this->latch_);
    __stat_loc = (void *)0x0;
    iVar1 = pthread_create(&this->pthreadId_,(pthread_attr_t *)0x0,startThread,this_00);
    if (iVar1 != 0) {
      this->started_ = false;
      ThreadData::~ThreadData(this_00);
      operator_delete(this_00);
      return;
    }
    CountDownLatch::wait(&this->latch_,__stat_loc);
    if (0 < this->tid_) {
      return;
    }
    __assertion = "tid_ > 0";
    __line = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/Thread.cpp"
                ,__line,"void Thread::start()");
}

Assistant:

void Thread::start() {
    assert(!started_);
    started_ = true;
    ThreadData* data = new ThreadData(func_, name_, &tid_, &latch_);
    if(pthread_create(&pthreadId_, NULL, &startThread, data)) {
        started_ = false;
        delete data;
    } else {
        latch_.wait();
        assert(tid_ > 0);
    }
}